

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanupFallback
          (SerialArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  ArenaBlock *this_00;
  __pointer_type pcVar2;
  CleanupNode *pCVar3;
  char *pcVar4;
  ArenaBlock *this_01;
  char *pcVar5;
  ArenaAlign AVar6;
  CleanupNode *pCVar7;
  __pointer_type pAVar8;
  CleanupNode *pCVar9;
  int line;
  __pointer_type pAVar10;
  size_t min_bytes;
  void *elem;
  SizedPtr SVar11;
  LogMessageFatal LStack_48;
  ulong local_38;
  
  do {
    if (align < 9) {
      min_bytes = n + 7 & 0xfffffffffffffff8;
    }
    else {
      AVar6 = ArenaAlignAs(align);
      if ((AVar6.align & 7) != 0) {
        __assert_fail("false && \"ArenaAlignDefault::IsAligned(align)\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
                      ,0x84,
                      "auto google::protobuf::internal::ArenaAlign::Padded(size_t)::(anonymous class)::operator()() const"
                     );
      }
      min_bytes = (AVar6.align + n) - 8;
    }
    this_00 = (this->head_)._M_b._M_p;
    if (this_00->size != 0) {
      pcVar2 = (this->ptr_)._M_b._M_p;
      local_38 = align;
      pcVar4 = ArenaBlock::Pointer(this_00,0x10);
      (this->space_used_).super___atomic_base<unsigned_long>._M_i =
           (__int_type_conflict2)
           (pcVar2 + ((this->space_used_).super___atomic_base<unsigned_long>._M_i - (long)pcVar4));
      align = local_38;
    }
    SVar11 = anon_unknown_12::AllocateBlock
                       ((AllocationPolicy *)
                        ((this->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8),this_00->size,
                        min_bytes);
    this_01 = (ArenaBlock *)SVar11.p;
    (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + SVar11.n;
    ArenaBlock::ArenaBlock(this_01,this_00,SVar11.n);
    pcVar4 = ArenaBlock::Pointer(this_01,0x10);
    pcVar5 = ArenaBlock::Pointer(this_01,this_01->size & 0xfffffffffffffff8);
    (this->ptr_)._M_b._M_p = pcVar4;
    this->prefetch_ptr_ = pcVar4;
    this->limit_ = pcVar5;
    (this->head_)._M_b._M_p = this_01;
    AVar6 = ArenaAlignAs(align);
    pcVar2 = (this->ptr_)._M_b._M_p;
    if (((ulong)pcVar2 & 7) != 0) {
      __assert_fail("false && \"ArenaAlignDefault::IsAligned(ptr)\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
                    ,0x90,
                    "auto google::protobuf::internal::ArenaAlign::CeilDefaultAligned(char *)::(anonymous class)::operator()() const"
                   );
    }
    n = n + 7 & 0xfffffffffffffff8;
    elem = (void *)(-AVar6.align & (ulong)(pcVar2 + (AVar6.align - 1)));
    pAVar1 = (__pointer_type)((long)elem + n);
  } while ((__pointer_type)this->limit_ < pAVar1);
  (this->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar7 = (this->cleanup_list_).next_;
  if (pCVar7 < (this->cleanup_list_).limit_) {
    (this->cleanup_list_).next_ = pCVar7 + 1;
    pCVar7->elem = elem;
    pCVar7->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this->cleanup_list_,elem,destructor,this);
  }
  pCVar7 = (CleanupNode *)(this->cleanup_list_).prefetch_ptr_;
  if ((pCVar7 != (CleanupNode *)0x0) && (pCVar7 < (CleanupNode *)(this->cleanup_list_).head_)) {
    pcVar4 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    line = 0x136;
    goto LAB_00ef90d5;
  }
  pCVar3 = (this->cleanup_list_).next_;
  if (((long)pCVar7 - (long)pCVar3 < 0x181) &&
     (pCVar9 = (this->cleanup_list_).limit_, pCVar7 < pCVar9)) {
    if (pCVar3 < pCVar7) {
      pCVar3 = pCVar7;
    }
    pCVar7 = pCVar3;
    if (pCVar7 != (CleanupNode *)0x0) {
      if (pCVar7 + 0x18 < pCVar9) {
        pCVar9 = pCVar7 + 0x18;
      }
      for (; pCVar7 < pCVar9; pCVar7 = pCVar7 + 4) {
      }
      goto LAB_00ef8f80;
    }
  }
  else {
LAB_00ef8f80:
    (this->cleanup_list_).prefetch_ptr_ = (char *)pCVar7;
    pcVar4 = (this->ptr_)._M_b._M_p;
    if (this->limit_ < pcVar4) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,char_const*>
                         (this->limit_,pcVar4,"limit_ >= ptr()");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 != (Nonnull<const_char_*>)0x0) {
      line = 0xf2;
      goto LAB_00ef90d5;
    }
    pAVar10 = (__pointer_type)this->prefetch_ptr_;
    if ((pAVar10 != (__pointer_type)0x0) && (pAVar10 < (this->head_)._M_b._M_p)) {
      pcVar4 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      line = 0x12d;
      goto LAB_00ef90d5;
    }
    if ((0x400 < (long)pAVar10 - (long)pAVar1) ||
       (pAVar8 = (__pointer_type)this->limit_, pAVar8 <= pAVar10)) {
LAB_00ef8fca:
      this->prefetch_ptr_ = (char *)pAVar10;
      return elem;
    }
    if (pAVar1 < pAVar10) {
      pAVar1 = pAVar10;
    }
    pAVar10 = pAVar1;
    if (pAVar10 != (__pointer_type)0x0) {
      if (pAVar10 + 0x40 < pAVar8) {
        pAVar8 = pAVar10 + 0x40;
      }
      for (; pAVar10 < pAVar8; pAVar10 = pAVar10 + 4) {
      }
      goto LAB_00ef8fca;
    }
  }
  pcVar4 = "prefetch_ptr != nullptr";
  line = 0x122;
LAB_00ef90d5:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,line,pcVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_48);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  size_t required = AlignUpTo(n, align);
  AllocateNewBlock(required);
  return AllocateAlignedWithCleanup(n, align, destructor);
}